

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFields
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (0 < *(int *)(desc + 0x2c)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      lVar2 = *(long *)(desc + 0x30);
      if (*(char *)(lVar2 + 0x50 + lVar3) == '\x01') {
        iVar1 = std::__cxx11::string::compare
                          ((char *)**(undefined8 **)(*(long *)(lVar2 + 0x58 + lVar3) + 0x10));
        if (iVar1 != 0) {
          lVar2 = *(long *)(desc + 0x30);
          goto LAB_002205df;
        }
      }
      else {
LAB_002205df:
        GenerateClassField(this,options,printer,(FieldDescriptor *)(lVar2 + lVar3));
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0xa8;
    } while (lVar4 < *(int *)(desc + 0x2c));
  }
  return;
}

Assistant:

void Generator::GenerateClassFields(const GeneratorOptions& options,
                                    io::Printer* printer,
                                    const Descriptor* desc) const {
  for (int i = 0; i < desc->field_count(); i++) {
    if (!IgnoreField(desc->field(i))) {
      GenerateClassField(options, printer, desc->field(i));
    }
  }
}